

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

void tlbi_aa64_alle1is_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ushort idxmap;
  
  if (((env->features >> 0x21 & 1) == 0) || (idxmap = 0x380, ((env->cp15).scr_el3 & 1) != 0)) {
    idxmap = (ushort)(((uint)(env->features >> 0x20) & 1) << 0xb) | 0xd;
  }
  tlb_flush_by_mmuidx_all_cpus_synced_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),idxmap)
  ;
  return;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}